

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall icu_63::SimpleTimeZone::decodeEndRule(SimpleTimeZone *this,UErrorCode *status)

{
  char cVar1;
  char cVar2;
  EMode EVar3;
  bool bVar4;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    bVar4 = this->startDay != '\0';
    cVar1 = this->endDay;
    this->useDaylight = cVar1 != '\0' && bVar4;
    if ((cVar1 != '\0' && bVar4) && (this->dstSavings == 0)) {
      this->dstSavings = 3600000;
    }
    if (cVar1 != '\0') {
      if (((0xb < (ulong)(byte)this->endMonth) || (86400000 < (uint)this->endTime)) ||
         (UTC_TIME < this->endTimeMode)) {
LAB_001ee9a8:
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
      }
      cVar2 = this->endDayOfWeek;
      if (cVar2 == '\0') {
        this->endMode = DOM_MODE;
      }
      else {
        EVar3 = DOW_IN_MONTH_MODE;
        if (cVar2 < '\x01') {
          this->endDayOfWeek = -cVar2;
          EVar3 = DOW_GE_DOM_MODE;
          if (cVar1 < '\x01') {
            this->endDay = -cVar1;
            EVar3 = DOW_LE_DOM_MODE;
          }
        }
        this->endMode = EVar3;
        if ('\a' < this->endDayOfWeek) goto LAB_001ee9a8;
      }
      cVar1 = this->endDay;
      if (this->endMode == DOW_IN_MONTH_MODE) {
        if ((byte)(cVar1 - 6U) < 0xf5) goto LAB_001ee9a8;
      }
      else if ((cVar1 < '\x01') || ((char)STATICMONTHLENGTH[(byte)this->endMonth] < cVar1))
      goto LAB_001ee9a8;
    }
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }